

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O1

void __thiscall
soul::heart::Printer::PrinterStream::printArgList
          (PrinterStream *this,ArrayView<soul::pool_ref<soul::heart::Expression>_> *args)

{
  pool_ref<soul::heart::Expression> *ppVar1;
  CodePrinter *this_00;
  size_t sVar2;
  bool bVar3;
  pool_ref<soul::heart::Expression> *arg;
  pool_ref<soul::heart::Expression> *ppVar4;
  string_view text;
  string_view text_00;
  string_view text_01;
  char s [2];
  char local_4a [2];
  string local_48;
  
  if (args->s != args->e) {
    text._M_str = " (";
    text._M_len = 2;
    choc::text::CodePrinter::writeBlock(this->out,text);
    ppVar4 = args->s;
    ppVar1 = args->e;
    if (ppVar4 != ppVar1) {
      bVar3 = true;
      do {
        if (bVar3) {
          bVar3 = false;
        }
        else {
          text_00._M_str = ", ";
          text_00._M_len = 2;
          choc::text::CodePrinter::writeBlock(this->out,text_00);
        }
        printExpression(this,ppVar4->object);
        ppVar4 = ppVar4 + 1;
      } while (ppVar4 != ppVar1);
    }
    this_00 = this->out;
    local_4a[0] = ')';
    local_4a[1] = '\0';
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    sVar2 = strlen(local_4a);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,local_4a,local_4a + sVar2);
    choc::text::CodePrinter::append(this_00,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  text_01._M_str = "()";
  text_01._M_len = 2;
  choc::text::CodePrinter::writeBlock(this->out,text_01);
  return;
}

Assistant:

void printArgList (const ArrayView<pool_ref<heart::Expression>>& args)
        {
            if (args.empty())
            {
                out << "()";
                return;
            }

            out << " (";
            bool isFirst = true;

            for (auto& arg : args)
            {
                if (isFirst)
                    isFirst = false;
                else
                    out << ", ";

                printExpression (arg);
            }

            out << ')';
        }